

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O0

void __thiscall
iu_NoEffectFileUnitTest_x_iutest_x_Call_Test::~iu_NoEffectFileUnitTest_x_iutest_x_Call_Test
          (iu_NoEffectFileUnitTest_x_iutest_x_Call_Test *this)

{
  iu_NoEffectFileUnitTest_x_iutest_x_Call_Test *this_local;
  
  ~iu_NoEffectFileUnitTest_x_iutest_x_Call_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(NoEffectFileUnitTest, Call)
{
    ::iutest::detail::NoEffectFile file;
    ::iutest::internal::FilePath filename(__FILE__);
    IUTEST_ASSERT_TRUE( file.Open(filename.string().c_str(), iutest::IFile::OpenAppend) );
    IUTEST_EXPECT_TRUE( file.Write(NULL, 0, 0) );
    IUTEST_EXPECT_TRUE( file.Read(NULL, 0, 0) );
    IUTEST_EXPECT_EQ(0u, file.GetSize());
}